

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O2

void __thiscall Assimp::LWO::Shader::~Shader(Shader *this)

{
  std::__cxx11::string::~string((string *)&this->functionName);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Shader()
        :   ordinal         ("\x00")
        ,   functionName    ("unknown")
        ,   enabled         (true)
    {}